

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qsqlquerymodel.cpp
# Opt level: O0

void __thiscall QSqlQueryModelPrivate::initColOffsets(QSqlQueryModelPrivate *this,int size)

{
  int *__s;
  size_type sVar1;
  QVarLengthArray<int,_56LL> *in_RDI;
  qsizetype in_stack_ffffffffffffffd8;
  
  QVarLengthArray<int,_56LL>::resize(in_RDI,in_stack_ffffffffffffffd8);
  __s = QVLABase<int>::data((QVLABase<int> *)
                            (in_RDI[1].super_QVLAStorage<4UL,_4UL,_56LL>.array + 0x18));
  sVar1 = QVLABaseBase::size((QVLABaseBase *)
                             (in_RDI[1].super_QVLAStorage<4UL,_4UL,_56LL>.array + 0x18));
  memset(__s,0,sVar1 << 2);
  return;
}

Assistant:

void QSqlQueryModelPrivate::initColOffsets(int size)
{
    colOffsets.resize(size);
    memset(colOffsets.data(), 0, colOffsets.size() * sizeof(int));
}